

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ConcurrentAtomicCounterCase::
genComputeSource_abi_cxx11_(string *__return_storage_ptr__,void *this,bool evenOdd)

{
  _anonymous_namespace_ *this_00;
  ostream *poVar1;
  Context *context;
  char *code;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream buf;
  bool evenOdd_local;
  ConcurrentAtomicCounterCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"${GLSL_VERSION_DECL}\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (binding = 1, std430) writeonly buffer IntermediateResults\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\thighp uint values[");
  code = (char *)this;
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)((long)this + 0x7c) * *(int *)((long)this + 0x78));
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} sb_ires;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n");
  poVar1 = std::operator<<(poVar1,"uniform highp uint u_callNdx;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main ()\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\thighp uint dataNdx = u_callNdx * ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x7c));
  poVar1 = std::operator<<(poVar1,"u + gl_GlobalInvocationID.x;\n");
  poVar1 = std::operator<<(poVar1,"\tif ((dataNdx % 2u) == ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(byte)~evenOdd & 1);
  poVar1 = std::operator<<(poVar1,"u)\n");
  poVar1 = std::operator<<(poVar1,
                           "\t\tsb_ires.values[dataNdx] = atomicCounterIncrement(u_counter);\n");
  std::operator<<(poVar1,"}");
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::ostringstream::str();
  context = (Context *)std::__cxx11::string::c_str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,context,code);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ConcurrentAtomicCounterCase::genComputeSource (bool evenOdd) const
{
	std::ostringstream buf;

	buf	<< "${GLSL_VERSION_DECL}\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout (binding = 1, std430) writeonly buffer IntermediateResults\n"
		<< "{\n"
		<< "	highp uint values[" << m_workSize * m_numCalls << "];\n"
		<< "} sb_ires;\n"
		<< "\n"
		<< "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n"
		<< "uniform highp uint u_callNdx;\n"
		<< "\n"
		<< "void main ()\n"
		<< "{\n"
		<< "	highp uint dataNdx = u_callNdx * " << m_workSize << "u + gl_GlobalInvocationID.x;\n"
		<< "	if ((dataNdx % 2u) == " << ((evenOdd) ? (0) : (1)) << "u)\n"
		<< "		sb_ires.values[dataNdx] = atomicCounterIncrement(u_counter);\n"
		<< "}";

	return specializeShader(m_context, buf.str().c_str());
}